

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O0

int __thiscall KParser::_cmp_expr(KParser *this,int begin,BlockInfo *bi)

{
  TokenType TVar1;
  int iVar2;
  reference pvVar3;
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  BlockInfo local_108;
  string local_c8 [8];
  string rightValue;
  TokenType tokenValue;
  int tryI;
  BlockInfo local_90;
  string local_50 [8];
  string leftValue;
  int local_2c;
  int t;
  int i;
  BlockInfo *bi_local;
  int begin_local;
  KParser *this_local;
  
  pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)begin);
  std::__cxx11::string::string(local_50,(string *)pvVar3);
  BlockInfo::BlockInfo(&local_90,bi);
  local_2c = _add_expr(this,begin,&local_90);
  BlockInfo::~BlockInfo(&local_90);
  if (local_2c < 0) {
    this_local._4_4_ = -1;
  }
  else {
    pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[](&this->m_tokens,(long)local_2c);
    TVar1 = pvVar3->tokenType;
    if ((((TVar1 == equal) || (TVar1 == not_equal)) || (TVar1 == less_than)) ||
       (((TVar1 == less_than_equal || (TVar1 == greater_than)) || (TVar1 == greater_than_equal)))) {
      pvVar3 = std::vector<Token,_std::allocator<Token>_>::operator[]
                         (&this->m_tokens,(long)(local_2c + 1));
      std::__cxx11::string::string(local_c8,(string *)pvVar3);
      BlockInfo::BlockInfo(&local_108,bi);
      iVar2 = _add_expr(this,local_2c + 1,&local_108);
      BlockInfo::~BlockInfo(&local_108);
      if (-1 < iVar2) {
        local_2c = iVar2;
        if (TVar1 == equal) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_128,"eq",&local_129);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_150,"",&local_151);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_178,"",&local_179);
          addCode(this,(string *)local_128,(string *)local_150,(string *)local_178);
          std::__cxx11::string::~string(local_178);
          std::allocator<char>::~allocator((allocator<char> *)&local_179);
          std::__cxx11::string::~string(local_150);
          std::allocator<char>::~allocator((allocator<char> *)&local_151);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
        }
        else if (TVar1 == not_equal) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a0,"neq",&local_1a1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1c8,"",&local_1c9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f0,"",&local_1f1);
          addCode(this,(string *)local_1a0,(string *)local_1c8,(string *)local_1f0);
          std::__cxx11::string::~string(local_1f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
          std::__cxx11::string::~string(local_1c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
          std::__cxx11::string::~string(local_1a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        }
        else if (TVar1 == less_than) {
          printf("lt!!\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_218,"lt",&local_219);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_240,"",&local_241);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_268,"",&local_269);
          addCode(this,(string *)local_218,(string *)local_240,(string *)local_268);
          std::__cxx11::string::~string(local_268);
          std::allocator<char>::~allocator((allocator<char> *)&local_269);
          std::__cxx11::string::~string(local_240);
          std::allocator<char>::~allocator((allocator<char> *)&local_241);
          std::__cxx11::string::~string(local_218);
          std::allocator<char>::~allocator((allocator<char> *)&local_219);
        }
        else if (TVar1 == less_than_equal) {
          printf("lte!!\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_290,"lte",&local_291);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2b8,"",&local_2b9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e0,"",&local_2e1);
          addCode(this,(string *)local_290,(string *)local_2b8,(string *)local_2e0);
          std::__cxx11::string::~string(local_2e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
          std::__cxx11::string::~string(local_2b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
          std::__cxx11::string::~string(local_290);
          std::allocator<char>::~allocator((allocator<char> *)&local_291);
        }
        else if (TVar1 == greater_than) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_308,"gt",&local_309);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_330,"",&local_331);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_358,"",&local_359);
          addCode(this,(string *)local_308,(string *)local_330,(string *)local_358);
          std::__cxx11::string::~string(local_358);
          std::allocator<char>::~allocator((allocator<char> *)&local_359);
          std::__cxx11::string::~string(local_330);
          std::allocator<char>::~allocator((allocator<char> *)&local_331);
          std::__cxx11::string::~string(local_308);
          std::allocator<char>::~allocator((allocator<char> *)&local_309);
        }
        else if (TVar1 == greater_than_equal) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_380,"gte",&local_381);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3a8,"",&local_3a9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_3d0,"",&local_3d1);
          addCode(this,(string *)local_380,(string *)local_3a8,(string *)local_3d0);
          std::__cxx11::string::~string(local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
          std::__cxx11::string::~string(local_3a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
          std::__cxx11::string::~string(local_380);
          std::allocator<char>::~allocator((allocator<char> *)&local_381);
        }
      }
      std::__cxx11::string::~string(local_c8);
    }
    this_local._4_4_ = local_2c;
  }
  std::__cxx11::string::~string(local_50);
  return this_local._4_4_;
}

Assistant:

int KParser::_cmp_expr(int begin,  BlockInfo bi) {
    int i = begin;
    int t;
    std::string leftValue = m_tokens[i].str;
    t = _add_expr(i, bi);
    if (t < 0) {
        return -1;
    }
    i = t;

    do {
        int tryI = i;
        auto tokenValue = m_tokens[tryI].tokenType;
        if(tokenValue != TokenType::equal 
           && tokenValue != TokenType::not_equal
           && tokenValue != TokenType::less_than
           && tokenValue != TokenType::less_than_equal
           && tokenValue != TokenType::greater_than
           && tokenValue != TokenType::greater_than_equal
           ) {
            break;
        }
        tryI++;
        std::string rightValue = m_tokens[tryI].str;
        t = _add_expr(tryI, bi);
        if (t < 0) {
            break;
        }
        // bi.addCode(leftValue);
        // bi.addCode(rightValue);
        if(tokenValue == TokenType::equal) {
            addCode("eq", "", "");
        } else if(tokenValue == TokenType::not_equal) {
            addCode("neq", "", "");
        }else if(tokenValue == TokenType::less_than) {
            printf("lt!!\n");
            addCode("lt", "", "");
        }else if(tokenValue == TokenType::less_than_equal) {
            printf("lte!!\n");
            addCode("lte", "", "");
        }else if(tokenValue == TokenType::greater_than) {
            addCode("gt", "", "");
        }else if(tokenValue == TokenType::greater_than_equal) {
            addCode("gte", "", "");
        } 
        i = t; 
    } while(0);
    return i;
}